

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resonant_filter.cc
# Opt level: O2

float __thiscall ResonantFilter1::Gen(ResonantFilter1 *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  float *pfVar6;
  ulong uVar7;
  uint uVar8;
  float in_XMM0_Da;
  undefined8 in_XMM0_Qb;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined8 in_XMM1_Qa;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined8 in_XMM2_Qb;
  
  (**this->src_->_vptr_MonoSource)();
  uVar8 = (this->buf_).idx_;
  uVar5 = (this->buf_).size_;
  auVar9._0_8_ = (double)in_XMM0_Da;
  auVar9._8_8_ = in_XMM0_Qb;
  pfVar6 = (this->buf_).buf_;
  auVar13._0_8_ = (double)pfVar6[(ulong)uVar8 % (ulong)uVar5];
  auVar13._8_8_ = in_XMM1_Qa;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = this->a_[0];
  auVar1 = vfnmadd132sd_fma(auVar13,auVar9,auVar1);
  auVar10._0_8_ = (double)pfVar6[(ulong)(uVar8 + 1) % (ulong)uVar5];
  auVar10._8_8_ = in_XMM2_Qb;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = this->a_[1];
  auVar1 = vfnmadd132sd_fma(auVar10,auVar1,auVar2);
  uVar7 = (ulong)((uVar8 - 1) + uVar5) % (ulong)uVar5;
  uVar8 = (uint)uVar7;
  (this->buf_).idx_ = uVar8;
  pfVar6[uVar7] = (float)auVar1._0_8_;
  auVar11._0_8_ = (double)(float)auVar1._0_8_;
  auVar11._8_8_ = auVar1._8_8_;
  uVar7 = (ulong)(uVar8 + 1);
  if (uVar8 + 1 == uVar5) {
    uVar7 = 0;
  }
  auVar3._8_8_ = 0;
  auVar3._0_8_ = this->b_[0];
  auVar14._8_8_ = 0;
  auVar14._0_8_ = (double)pfVar6[uVar7] * this->b_[1];
  auVar1 = vfmadd231sd_fma(auVar14,auVar11,auVar3);
  auVar12._0_8_ = (double)pfVar6[(ulong)(uVar8 + 2) % (ulong)uVar5];
  auVar12._8_8_ = in_XMM2_Qb;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = this->b_[2];
  auVar1 = vfmadd132sd_fma(auVar12,auVar1,auVar4);
  return (float)auVar1._0_8_;
}

Assistant:

float ResonantFilter1::Gen()
{
    double v = src_->Gen();
    buf_.push_front(v - a_[0] * buf_[0] - a_[1] * buf_[1]);
    v = b_[0] * buf_[0] + b_[1] * buf_[1] + b_[2] * buf_[2];
    return v;
}